

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O1

void __thiscall ExprWriter::visit(ExprWriter *this,StackAlloc *expr)

{
  ostream *poVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  poVar1 = this->ss;
  iVar2 = (*(expr->super_ExprBase).super_Expr._vptr_Expr[4])(expr);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))
            (&local_40,(long *)CONCAT44(extraout_var,iVar2));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_40,local_38);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->ss," ",1);
  poVar1 = this->ss;
  iVar2 = (*(expr->super_ExprBase).super_Expr._vptr_Expr[4])(expr);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x20))
            (&local_40,(long *)CONCAT44(extraout_var_00,iVar2),&expr->value->valueName);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_40,local_38);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

void ExprWriter::visit(StackAlloc& expr) {
    ss << expr.getType()->toString();
    ss << " ";
    ss << expr.getType()->surroundName(expr.value->valueName);
}